

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O0

void __thiscall BamTools::Internal::BamStandardIndex::RaiiWrapper::~RaiiWrapper(RaiiWrapper *this)

{
  long *in_RDI;
  
  if (*in_RDI != 0) {
    (**(code **)(*(long *)*in_RDI + 0x10))();
    if ((long *)*in_RDI != (long *)0x0) {
      (**(code **)(*(long *)*in_RDI + 8))();
    }
    *in_RDI = 0;
  }
  if (in_RDI[1] != 0) {
    if ((void *)in_RDI[1] != (void *)0x0) {
      operator_delete__((void *)in_RDI[1]);
    }
    in_RDI[1] = 0;
  }
  return;
}

Assistant:

BamStandardIndex::RaiiWrapper::~RaiiWrapper()
{

    if (Device) {
        Device->Close();
        delete Device;
        Device = 0;
    }

    if (Buffer) {
        delete[] Buffer;
        Buffer = 0;
    }
}